

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O1

ContextRef VerifyContext(ALCcontext *context)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 uVar5;
  int *in_RSI;
  ulong uVar6;
  ulong uVar7;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  uVar7 = (long)DAT_001b2998 - (long)(anonymous_namespace)::ContextList >> 3;
  puVar3 = (anonymous_namespace)::ContextList;
  while (puVar2 = puVar3, 0 < (long)uVar7) {
    uVar6 = uVar7 >> 1;
    uVar7 = ~uVar6 + uVar7;
    puVar3 = puVar2 + uVar6 + 1;
    if (in_RSI <= (int *)puVar2[uVar6]) {
      uVar7 = uVar6;
      puVar3 = puVar2;
    }
  }
  if ((puVar2 == DAT_001b2998) || (piVar1 = (int *)*puVar2, piVar1 != in_RSI)) {
    uVar5 = 0;
  }
  else {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    uVar5 = *puVar2;
  }
  *(undefined8 *)context = uVar5;
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::ListLock);
  return (ContextRef)context;
}

Assistant:

static ContextRef VerifyContext(ALCcontext *context)
{
    std::lock_guard<std::recursive_mutex> _{ListLock};
    auto iter = std::lower_bound(ContextList.begin(), ContextList.end(), context);
    if(iter != ContextList.end() && *iter == context)
    {
        (*iter)->add_ref();
        return ContextRef{*iter};
    }
    return nullptr;
}